

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Db;
  undefined1 extraout_var [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar17 [16];
  Mat local_68;
  
  uVar10 = 0;
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar12 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar12;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  local_68.elemsize = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.data = (void *)0x0;
  local_68.refcount = (int *)0x0;
  Mat::create(&local_68,4,uVar2 * uVar1,4,(Allocator *)0x0);
  auVar15._0_4_ = (float)iVar5;
  auVar15._4_12_ = extraout_var;
  fVar12 = auVar15._0_4_ * 0.5;
  pvVar3 = (this->ratios).data;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = uVar10;
  }
  auVar16 = auVar15;
  for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
    fVar14 = *(float *)((long)pvVar3 + uVar8 * 4);
    auVar16 = rsqrtss(auVar16,ZEXT416((uint)fVar14));
    fVar13 = auVar16._0_4_;
    fVar13 = roundf(fVar13 * -0.5 * auVar15._0_4_ * (fVar14 * fVar13 * fVar13 + -3.0));
    pvVar4 = (this->scales).data;
    fVar14 = roundf(fVar14 * (float)(int)fVar13);
    auVar17._0_4_ = (float)(int)fVar14;
    auVar17._4_4_ = (float)(int)extraout_var_00._0_4_;
    auVar17._8_4_ = (float)(int)extraout_var_00._4_4_;
    auVar17._12_4_ = (float)(int)extraout_var_00._8_4_;
    pfVar6 = (float *)(uVar10 * (long)local_68.w + (long)local_68.data);
    auVar16 = auVar17;
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      fVar14 = *(float *)((long)pvVar4 + uVar7 * 4) * 0.5;
      auVar16._0_4_ = fVar14 * (float)(int)fVar13;
      auVar16._4_4_ = fVar14 * auVar17._0_4_;
      auVar16._8_4_ = fVar14 * (float)(int)extraout_XMM0_Db;
      auVar16._12_4_ = fVar14 * auVar17._4_4_;
      *pfVar6 = fVar12 - auVar16._0_4_;
      pfVar6[1] = fVar12 - auVar16._4_4_;
      pfVar6[2] = auVar16._0_4_ + fVar12;
      pfVar6[3] = auVar16._4_4_ + fVar12;
      pfVar6 = pfVar6 + local_68.w;
    }
    uVar10 = uVar10 + (long)(int)uVar2 * 4;
  }
  Mat::operator=(&this->anchors,&local_68);
  Mat::~Mat(&local_68);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}